

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_factory.h
# Opt level: O0

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
 draco::
 CreateMeshPredictionScheme<draco::MeshDecoder,draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>,draco::MeshPredictionSchemeDecoderFactory<int>>
           (MeshDecoder *source,PredictionSchemeMethod method,int att_id,Transform *transform,
           uint16_t bitstream_version)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Mesh *pMVar3;
  uint in_ECX;
  int in_EDX;
  MeshDecoder *in_RSI;
  PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>
  *in_RDI;
  ushort in_R9W;
  MeshPredictionSchemeDecoderFactory<int> factory_1;
  MeshData_conflict md_1;
  MeshPredictionSchemeDecoderFactory<int> factory;
  MeshData md;
  MeshAttributeCornerTable *att_ct;
  MeshAttributeIndicesEncodingData *encoding_data;
  CornerTable *ct;
  PointAttribute *att;
  unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
  *ret;
  uint in_stack_ffffffffffffff48;
  int32_t in_stack_ffffffffffffff4c;
  PointCloud *in_stack_ffffffffffffff50;
  _Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_*,_false>
  transform_00;
  uint6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff6f;
  PredictionSchemeMethod in_stack_ffffffffffffff74;
  CornerTable *in_stack_ffffffffffffff78;
  uint16_t in_stack_ffffffffffffff90;
  uint uVar5;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> local_68;
  CornerTable *local_48;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *local_40;
  CornerTable *local_38;
  PointAttribute *local_30;
  ushort local_22;
  uint local_18;
  int local_14;
  MeshDecoder *local_10;
  
  transform_00._M_head_impl = in_RDI;
  local_22 = in_R9W;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  PointCloudDecoder::point_cloud(&in_RSI->super_PointCloudDecoder);
  local_30 = PointCloud::attribute(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  iVar2 = (*(local_10->super_PointCloudDecoder)._vptr_PointCloudDecoder[2])();
  if ((iVar2 == 1) &&
     (((((local_14 == 1 || (local_14 == 2)) || (local_14 == 4)) ||
       ((local_14 == 5 || (local_14 == 6)))) || (local_14 == 3)))) {
    iVar2 = (*(local_10->super_PointCloudDecoder)._vptr_PointCloudDecoder[9])();
    local_38 = (CornerTable *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(local_10->super_PointCloudDecoder)._vptr_PointCloudDecoder[0xb])
                      (local_10,(ulong)local_18);
    local_40 = (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                *)CONCAT44(extraout_var_00,iVar2);
    if ((local_38 == (CornerTable *)0x0) ||
       (local_40 ==
        (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         *)0x0)) {
      std::
      unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>>>
      ::
      unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>>,void>
                ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                  *)in_stack_ffffffffffffff50,
                 (nullptr_t)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>,_true,_true>
              )(tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                )transform_00._M_head_impl;
    }
    iVar2 = (*(local_10->super_PointCloudDecoder)._vptr_PointCloudDecoder[10])
                      (local_10,(ulong)local_18);
    local_48 = (CornerTable *)CONCAT44(extraout_var_01,iVar2);
    if (local_48 == (CornerTable *)0x0) {
      MeshPredictionSchemeData<draco::CornerTable>::MeshPredictionSchemeData
                ((MeshPredictionSchemeData<draco::CornerTable> *)&stack0xffffffffffffff70);
      pMVar3 = MeshDecoder::mesh(local_10);
      MeshPredictionSchemeData<draco::CornerTable>::Set
                ((MeshPredictionSchemeData<draco::CornerTable> *)&stack0xffffffffffffff70,pMVar3,
                 local_38,local_40,(vector<int,_std::allocator<int>_> *)(local_40 + 1));
      bVar4 = 0;
      in_stack_ffffffffffffff48 = (uint)local_22;
      MeshPredictionSchemeDecoderFactory<int>::operator()
                ((MeshPredictionSchemeDecoderFactory<int> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74,
                 (PointAttribute *)
                 CONCAT17(in_stack_ffffffffffffff6f,(uint7)in_stack_ffffffffffffff68),
                 (PredictionSchemeNormalOctahedronDecodingTransform<int> *)transform_00._M_head_impl
                 ,(MeshPredictionSchemeData<draco::CornerTable> *)in_RDI,in_stack_ffffffffffffff90);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                          *)0x1f250a);
      if (bVar1) {
        bVar4 = 1;
      }
      uVar5 = (uint)bVar1;
      if ((bVar4 & 1) == 0) {
        std::
        unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
        ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                       *)in_stack_ffffffffffffff50);
      }
    }
    else {
      MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::MeshPredictionSchemeData(&local_68)
      ;
      pMVar3 = MeshDecoder::mesh(local_10);
      MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::Set
                (&local_68,pMVar3,local_48,local_40,
                 (vector<int,_std::allocator<int>_> *)(local_40 + 1));
      in_stack_ffffffffffffff48 = (uint)local_22;
      MeshPredictionSchemeDecoderFactory<int>::operator()
                ((MeshPredictionSchemeDecoderFactory<int> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74,
                 (PointAttribute *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 (PredictionSchemeNormalOctahedronDecodingTransform<int> *)transform_00._M_head_impl
                 ,(MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *)in_RDI,
                 in_stack_ffffffffffffff90);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                          *)0x1f2449);
      uVar5 = (uint)bVar1;
      if (!bVar1) {
        std::
        unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
        ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
                       *)in_stack_ffffffffffffff50);
      }
    }
    if (uVar5 != 0) {
      return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>,_true,_true>
              )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>,_true,_true>
                )transform_00._M_head_impl;
    }
  }
  std::
  unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>>>
  ::
  unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>>,void>
            ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
              *)in_stack_ffffffffffffff50,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>,_true,_true>
          )(tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>_>_>
            )transform_00._M_head_impl;
}

Assistant:

std::unique_ptr<PredictionSchemeT> CreateMeshPredictionScheme(
    const EncodingDataSourceT *source, PredictionSchemeMethod method,
    int att_id, const typename PredictionSchemeT::Transform &transform,
    uint16_t bitstream_version) {
  const PointAttribute *const att = source->point_cloud()->attribute(att_id);
  if (source->GetGeometryType() == TRIANGULAR_MESH &&
      (method == MESH_PREDICTION_PARALLELOGRAM ||
       method == MESH_PREDICTION_MULTI_PARALLELOGRAM ||
       method == MESH_PREDICTION_CONSTRAINED_MULTI_PARALLELOGRAM ||
       method == MESH_PREDICTION_TEX_COORDS_PORTABLE ||
       method == MESH_PREDICTION_GEOMETRIC_NORMAL ||
       method == MESH_PREDICTION_TEX_COORDS_DEPRECATED)) {
    const CornerTable *const ct = source->GetCornerTable();
    const MeshAttributeIndicesEncodingData *const encoding_data =
        source->GetAttributeEncodingData(att_id);
    if (ct == nullptr || encoding_data == nullptr) {
      // No connectivity data found.
      return nullptr;
    }
    // Connectivity data exists.
    const MeshAttributeCornerTable *const att_ct =
        source->GetAttributeCornerTable(att_id);
    if (att_ct != nullptr) {
      typedef MeshPredictionSchemeData<MeshAttributeCornerTable> MeshData;
      MeshData md;
      md.Set(source->mesh(), att_ct,
             &encoding_data->encoded_attribute_value_index_to_corner_map,
             &encoding_data->vertex_to_encoded_attribute_value_index_map);
      MeshPredictionSchemeFactoryT factory;
      auto ret = factory(method, att, transform, md, bitstream_version);
      if (ret) {
        return ret;
      }
    } else {
      typedef MeshPredictionSchemeData<CornerTable> MeshData;
      MeshData md;
      md.Set(source->mesh(), ct,
             &encoding_data->encoded_attribute_value_index_to_corner_map,
             &encoding_data->vertex_to_encoded_attribute_value_index_map);
      MeshPredictionSchemeFactoryT factory;
      auto ret = factory(method, att, transform, md, bitstream_version);
      if (ret) {
        return ret;
      }
    }
  }
  return nullptr;
}